

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O3

uint32_t WriteBinaryScene(aiScene *scene)

{
  uint32_t uVar1;
  uint32_t uVar2;
  long lVar3;
  ulong uVar4;
  uint32_t t;
  undefined1 local_24 [4];
  
  fwrite(local_24,4,1,(FILE *)out);
  fwrite(local_24,4,1,(FILE *)out);
  lVar3 = ftell((FILE *)out);
  fwrite(local_24,4,1,(FILE *)out);
  fwrite(local_24,4,1,(FILE *)out);
  fwrite(local_24,4,1,(FILE *)out);
  fwrite(local_24,4,1,(FILE *)out);
  fwrite(local_24,4,1,(FILE *)out);
  fwrite(local_24,4,1,(FILE *)out);
  fwrite(local_24,4,1,(FILE *)out);
  uVar1 = WriteBinaryNode(scene->mRootNode);
  uVar1 = uVar1 + 0x24;
  if (scene->mNumMeshes != 0) {
    uVar4 = 0;
    do {
      uVar2 = WriteBinaryMesh(scene->mMeshes[uVar4]);
      uVar1 = uVar1 + uVar2 + 8;
      uVar4 = uVar4 + 1;
    } while (uVar4 < scene->mNumMeshes);
  }
  if (scene->mNumMaterials != 0) {
    uVar4 = 0;
    do {
      uVar2 = WriteBinaryMaterial(scene->mMaterials[uVar4]);
      uVar1 = uVar1 + uVar2 + 8;
      uVar4 = uVar4 + 1;
    } while (uVar4 < scene->mNumMaterials);
  }
  if (scene->mNumAnimations != 0) {
    uVar4 = 0;
    do {
      uVar2 = WriteBinaryAnim(scene->mAnimations[uVar4]);
      uVar1 = uVar1 + uVar2 + 8;
      uVar4 = uVar4 + 1;
    } while (uVar4 < scene->mNumAnimations);
  }
  if (scene->mNumTextures != 0) {
    uVar4 = 0;
    do {
      uVar2 = WriteBinaryTexture(scene->mTextures[uVar4]);
      uVar1 = uVar1 + uVar2 + 8;
      uVar4 = uVar4 + 1;
    } while (uVar4 < scene->mNumTextures);
  }
  if (scene->mNumLights != 0) {
    uVar4 = 0;
    do {
      uVar2 = WriteBinaryLight(scene->mLights[uVar4]);
      uVar1 = uVar1 + uVar2 + 8;
      uVar4 = uVar4 + 1;
    } while (uVar4 < scene->mNumLights);
  }
  if (scene->mNumCameras != 0) {
    uVar4 = 0;
    do {
      uVar2 = WriteBinaryCamera(scene->mCameras[uVar4]);
      uVar1 = uVar1 + uVar2 + 8;
      uVar4 = uVar4 + 1;
    } while (uVar4 < scene->mNumCameras);
  }
  ChangeInteger((int)lVar3 - 4,uVar1);
  return uVar1;
}

Assistant:

uint32_t WriteBinaryScene(const aiScene* scene)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AISCENE);

	// basic scene information
	len += Write<unsigned int>(scene->mFlags);
	len += Write<unsigned int>(scene->mNumMeshes);
	len += Write<unsigned int>(scene->mNumMaterials);
	len += Write<unsigned int>(scene->mNumAnimations);
	len += Write<unsigned int>(scene->mNumTextures);
	len += Write<unsigned int>(scene->mNumLights);
	len += Write<unsigned int>(scene->mNumCameras);
	
	// write node graph
	len += WriteBinaryNode(scene->mRootNode)+8;

	// write all meshes
	for (unsigned int i = 0; i < scene->mNumMeshes;++i) {
		const aiMesh* mesh = scene->mMeshes[i];
		len += WriteBinaryMesh(mesh)+8;
	}

	// write materials
	for (unsigned int i = 0; i< scene->mNumMaterials; ++i) {
		const aiMaterial* mat = scene->mMaterials[i];
		len += WriteBinaryMaterial(mat)+8;
	}

	// write all animations
	for (unsigned int i = 0; i < scene->mNumAnimations;++i) {
		const aiAnimation* anim = scene->mAnimations[i];
		len += WriteBinaryAnim(anim)+8;
	}


	// write all textures
	for (unsigned int i = 0; i < scene->mNumTextures;++i) {
		const aiTexture* mesh = scene->mTextures[i];
		len += WriteBinaryTexture(mesh)+8;
	}

	// write lights
	for (unsigned int i = 0; i < scene->mNumLights;++i) {
		const aiLight* l = scene->mLights[i];
		len += WriteBinaryLight(l)+8;
	}

	// write cameras
	for (unsigned int i = 0; i < scene->mNumCameras;++i) {
		const aiCamera* cam = scene->mCameras[i];
		len += WriteBinaryCamera(cam)+8;
	}

	ChangeInteger(old,len);
	return len;
}